

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O2

boolean encode_mcu(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  ushort uVar1;
  int iVar2;
  jpeg_entropy_encoder *pjVar3;
  int *piVar4;
  JBLOCKROW paJVar5;
  jpeg_component_info *pjVar6;
  bool bVar7;
  undefined4 uVar8;
  ushort uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var13;
  long lVar14;
  _func_void_j_compress_ptr *p_Var15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  
  pjVar3 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    uVar17 = *(uint *)&pjVar3[4].start_pass;
    if (uVar17 == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar3[4].start_pass + 4));
      uVar17 = cinfo->restart_interval;
      *(uint *)((long)&pjVar3[4].start_pass + 4) =
           *(int *)((long)&pjVar3[4].start_pass + 4) + 1U & 7;
    }
    *(uint *)&pjVar3[4].start_pass = uVar17 - 1;
  }
  piVar4 = cinfo->natural_order;
  lVar10 = 0;
  do {
    if (cinfo->blocks_in_MCU <= lVar10) {
      return 1;
    }
    paJVar5 = MCU_data[lVar10];
    lVar14 = (long)cinfo->MCU_membership[lVar10];
    pjVar6 = cinfo->cur_comp_info[lVar14];
    iVar2 = pjVar6->dc_tbl_no;
    p_Var13 = (&pjVar3[4].encode_mcu)[iVar2] + *(int *)((long)&pjVar3[3].encode_mcu + lVar14 * 4);
    iVar11 = (int)(*paJVar5)[0] - *(int *)((long)&pjVar3[2].finish_pass + lVar14 * 4);
    if (iVar11 == 0) {
      arith_encode(cinfo,(uchar *)p_Var13,0);
      *(undefined4 *)((long)&pjVar3[3].encode_mcu + lVar14 * 4) = 0;
    }
    else {
      *(int *)((long)&pjVar3[2].finish_pass + lVar14 * 4) = (int)(*paJVar5)[0];
      arith_encode(cinfo,(uchar *)p_Var13,1);
      uVar17 = 0;
      bVar7 = iVar11 < 1;
      if (bVar7) {
        iVar11 = -iVar11;
        lVar19 = 3;
        uVar8 = 8;
      }
      else {
        lVar19 = 2;
        uVar8 = 4;
      }
      arith_encode(cinfo,(uchar *)(p_Var13 + 1),(uint)bVar7);
      p_Var13 = p_Var13 + lVar19;
      *(undefined4 *)((long)&pjVar3[3].encode_mcu + lVar14 * 4) = uVar8;
      uVar12 = iVar11 - 1;
      if (uVar12 != 0) {
        uVar17 = 1;
        arith_encode(cinfo,(uchar *)p_Var13,1);
        p_Var13 = (&pjVar3[4].encode_mcu)[iVar2] + 0x14;
        for (uVar18 = uVar12; 1 < uVar18; uVar18 = uVar18 >> 1) {
          arith_encode(cinfo,(uchar *)p_Var13,1);
          uVar17 = uVar17 * 2;
          p_Var13 = p_Var13 + 1;
        }
      }
      iVar11 = 0;
      arith_encode(cinfo,(uchar *)p_Var13,0);
      if ((int)uVar17 < (int)((ulong)(1L << (cinfo->arith_dc_L[iVar2] & 0x3f)) >> 1)) {
LAB_001c5d9d:
        *(int *)((long)&pjVar3[3].encode_mcu + lVar14 * 4) = iVar11;
      }
      else if ((int)((ulong)(1L << (cinfo->arith_dc_U[iVar2] & 0x3f)) >> 1) < (int)uVar17) {
        iVar11 = *(int *)((long)&pjVar3[3].encode_mcu + lVar14 * 4) + 8;
        goto LAB_001c5d9d;
      }
      while (1 < uVar17) {
        uVar17 = (int)uVar17 >> 1;
        arith_encode(cinfo,(uchar *)(p_Var13 + 0xe),(uint)((uVar17 & uVar12) != 0));
      }
    }
    lVar14 = (long)cinfo->lim_Se;
    if (lVar14 != 0) {
      iVar2 = pjVar6->ac_tbl_no;
      do {
        if ((*paJVar5)[piVar4[lVar14]] != 0) goto LAB_001c5b3e;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
      lVar14 = 0;
LAB_001c5b3e:
      iVar11 = 0;
      while (iVar11 < (int)lVar14) {
        p_Var15 = (&pjVar3[9].finish_pass)[iVar2];
        arith_encode(cinfo,(uchar *)(p_Var15 + iVar11 * 3),0);
        lVar19 = (long)iVar11;
        p_Var15 = p_Var15 + (long)(iVar11 * 3) + 2;
        while( true ) {
          iVar11 = iVar11 + 1;
          uVar1 = (*paJVar5)[piVar4[lVar19 + 1]];
          if (uVar1 != 0) break;
          arith_encode(cinfo,(uchar *)(p_Var15 + -1),0);
          p_Var15 = p_Var15 + 3;
          lVar19 = lVar19 + 1;
        }
        arith_encode(cinfo,(uchar *)(p_Var15 + -1),1);
        uVar9 = -uVar1;
        if (0 < (short)uVar1) {
          uVar9 = uVar1;
        }
        arith_encode(cinfo,(uchar *)(pjVar3 + 0xf),(uint)((short)uVar1 < 1));
        uVar17 = uVar9 - 1;
        if (uVar17 == 0) {
          uVar12 = 0;
        }
        else {
          arith_encode(cinfo,(uchar *)p_Var15,1);
          if (uVar17 == 1) {
            uVar12 = 1;
          }
          else {
            arith_encode(cinfo,(uchar *)p_Var15,1);
            lVar16 = 0xd9;
            if (lVar19 < (long)(ulong)cinfo->arith_ac_K[iVar2]) {
              lVar16 = 0xbd;
            }
            p_Var15 = (&pjVar3[9].finish_pass)[iVar2] + lVar16;
            uVar12 = 2;
            uVar18 = uVar17;
            while (uVar18 = (int)uVar18 >> 1, 1 < uVar18) {
              arith_encode(cinfo,(uchar *)p_Var15,1);
              uVar12 = uVar12 * 2;
              p_Var15 = p_Var15 + 1;
            }
          }
        }
        arith_encode(cinfo,(uchar *)p_Var15,0);
        while (1 < uVar12) {
          uVar12 = (int)uVar12 >> 1;
          arith_encode(cinfo,(uchar *)(p_Var15 + 0xe),(uint)((uVar12 & uVar17) != 0));
        }
      }
      if (iVar11 < cinfo->lim_Se) {
        arith_encode(cinfo,(uchar *)((&pjVar3[9].finish_pass)[iVar2] + iVar11 * 3),1);
      }
    }
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

METHODDEF(boolean)
encode_mcu (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  jpeg_component_info * compptr;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, k, ke;
  int v, v2, m;
  const int * natural_order;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  natural_order = cinfo->natural_order;

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Sections F.1.4.1 & F.1.4.4.1: Encoding of DC coefficients */

    tbl = compptr->dc_tbl_no;

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.4: Encode_DC_DIFF */
    if ((v = (*block)[0] - entropy->last_dc_val[ci]) == 0) {
      arith_encode(cinfo, st, 0);
      entropy->dc_context[ci] = 0;	/* zero diff category */
    } else {
      entropy->last_dc_val[ci] = (*block)[0];
      arith_encode(cinfo, st, 1);
      /* Figure F.6: Encoding nonzero value v */
      /* Figure F.7: Encoding the sign of v */
      if (v > 0) {
	arith_encode(cinfo, st + 1, 0);	/* Table F.4: SS = S0 + 1 */
	st += 2;			/* Table F.4: SP = S0 + 2 */
	entropy->dc_context[ci] = 4;	/* small positive diff category */
      } else {
	v = -v;
	arith_encode(cinfo, st + 1, 1);	/* Table F.4: SS = S0 + 1 */
	st += 3;			/* Table F.4: SN = S0 + 3 */
	entropy->dc_context[ci] = 8;	/* small negative diff category */
      }
      /* Figure F.8: Encoding the magnitude category of v */
      m = 0;
      if (v -= 1) {
	arith_encode(cinfo, st, 1);
	m = 1;
	v2 = v;
	st = entropy->dc_stats[tbl] + 20; /* Table F.4: X1 = 20 */
	while (v2 >>= 1) {
	  arith_encode(cinfo, st, 1);
	  m <<= 1;
	  st += 1;
	}
      }
      arith_encode(cinfo, st, 0);
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int) ((1L << cinfo->arith_dc_L[tbl]) >> 1))
	entropy->dc_context[ci] = 0;	/* zero diff category */
      else if (m > (int) ((1L << cinfo->arith_dc_U[tbl]) >> 1))
	entropy->dc_context[ci] += 8;	/* large diff category */
      /* Figure F.9: Encoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	arith_encode(cinfo, st, (m & v) ? 1 : 0);
    }

    /* Sections F.1.4.2 & F.1.4.4.2: Encoding of AC coefficients */

    if ((ke = cinfo->lim_Se) == 0) continue;
    tbl = compptr->ac_tbl_no;

    /* Establish EOB (end-of-block) index */
    do {
      if ((*block)[natural_order[ke]]) break;
    } while (--ke);

    /* Figure F.5: Encode_AC_Coefficients */
    for (k = 0; k < ke;) {
      st = entropy->ac_stats[tbl] + 3 * k;
      arith_encode(cinfo, st, 0);	/* EOB decision */
      while ((v = (*block)[natural_order[++k]]) == 0) {
	arith_encode(cinfo, st + 1, 0);
	st += 3;
      }
      arith_encode(cinfo, st + 1, 1);
      /* Figure F.6: Encoding nonzero value v */
      /* Figure F.7: Encoding the sign of v */
      if (v > 0) {
	arith_encode(cinfo, entropy->fixed_bin, 0);
      } else {
	v = -v;
	arith_encode(cinfo, entropy->fixed_bin, 1);
      }
      st += 2;
      /* Figure F.8: Encoding the magnitude category of v */
      m = 0;
      if (v -= 1) {
	arith_encode(cinfo, st, 1);
	m = 1;
	v2 = v;
	if (v2 >>= 1) {
	  arith_encode(cinfo, st, 1);
	  m <<= 1;
	  st = entropy->ac_stats[tbl] +
	       (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
	  while (v2 >>= 1) {
	    arith_encode(cinfo, st, 1);
	    m <<= 1;
	    st += 1;
	  }
	}
      }
      arith_encode(cinfo, st, 0);
      /* Figure F.9: Encoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	arith_encode(cinfo, st, (m & v) ? 1 : 0);
    }
    /* Encode EOB decision only if k < cinfo->lim_Se */
    if (k < cinfo->lim_Se) {
      st = entropy->ac_stats[tbl] + 3 * k;
      arith_encode(cinfo, st, 1);
    }
  }

  return TRUE;
}